

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Branch(TwoStepBranchingProcedure *this,size_t nodeId)

{
  StoredVertexList *this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong *puVar1;
  int iVar2;
  pointer psVar3;
  long lVar4;
  pointer psVar5;
  int *piVar6;
  iterator iVar7;
  _Storage<unsigned_long,_true> _Var8;
  bool bVar9;
  size_type sVar10;
  void *pvVar11;
  pointer puVar12;
  pointer psVar13;
  TwoStepBranchingProcedure *pTVar14;
  ulong uVar15;
  _Storage<unsigned_long,_true> _Var16;
  _Storage<unsigned_long,_true> _Var17;
  optional<unsigned_long> oVar18;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar19;
  vertex_descriptor leftNodeId_1;
  vertex_descriptor leftNodeId;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  _Storage<unsigned_long,_true> local_88;
  _Storage<unsigned_long,_true> local_80;
  _Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false> local_78;
  _Storage<unsigned_long,_true> local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined1 local_60 [8];
  undefined1 local_58 [24];
  pointer local_40;
  TwoStepBranchingProcedure *local_38;
  
  psVar3 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var17._M_value = nodeId * 0x30;
  if (*(Status *)((long)&psVar3[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    this_00 = &(this->tree).super_type.m_vertices;
    local_78._M_head_impl =
         *(PackingRelaxed2D **)
          &psVar3[nodeId].super_StoredVertex.m_property.Packing._M_t.
           super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
           ._M_t;
    psVar13 = *(pointer *)
               ((long)&psVar3[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
               + 8);
    lVar4 = *(long *)&psVar3[nodeId].super_StoredVertex.m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
    ;
    this_01 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)local_78._M_head_impl + 0x38);
    local_80 = (_Storage<unsigned_long,_true>)nodeId;
    sVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_01);
    if ((long)psVar13 - lVar4 >> 4 != sVar10) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&local_70);
      psVar3 = (this_00->
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar5 = *(pointer *)
                ((long)&psVar3[local_80._M_value].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      for (psVar13 = *(pointer *)
                      &psVar3[local_80._M_value].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar13 != psVar5; psVar13 = psVar13 + 1) {
        iVar2 = psVar3[(psVar13->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.
                m_property.super_BaseNode.ItemIdToPlace;
        puVar12 = (pointer)(long)iVar2;
        if (-1 < (long)puVar12) {
          if (local_40 <= puVar12) {
            __assert_fail("pos < m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                          0x40b,
                          "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
          puVar1 = (ulong *)(local_58._0_8_ + ((ulong)puVar12 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        }
      }
      _Var17 = (_Storage<unsigned_long,_true>)
               (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((int *)_Var17._M_value != piVar6) {
        lVar4 = (long)local_78._M_head_impl + 0x18;
        local_38 = this;
        do {
          iVar2 = *(int *)_Var17;
          uVar15 = (ulong)iVar2;
          bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)lVar4,
                             uVar15);
          if (((!bVar9) &&
              ((*(ulong *)(local_58._0_8_ + (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) == 0)) &&
             (bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                                (this_01,uVar15), pTVar14 = local_38, bVar9)) {
            local_88._M_value =
                 ((long)(local_38->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_38->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
            local_70._M_value._4_4_ = 0;
            local_68 = 2;
            local_70._M_value._0_4_ = iVar2;
            std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                      ((PackingRelaxed2D *)local_60);
            AddLeafNode(pTVar14,(Node *)&local_70);
            std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
            ~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                         *)local_60);
            _Var8 = local_80;
            _Var17 = local_88;
            _Var16 = local_88;
            if (local_88._M_value < local_80._M_value) {
              _Var16 = local_80;
            }
            if ((int *)(((long)(pTVar14->tree).super_type.m_vertices.
                               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar14->tree).super_type.m_vertices.
                               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                       ) <= _Var16._M_value) {
              std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::resize(this_00,_Var16._M_value + 1);
            }
            psVar3 = (this_00->
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_70._M_value._0_4_ = (undefined4)_Var17._M_value;
            local_70._M_value._4_4_ = (undefined4)((ulong)_Var17 >> 0x20);
            pvVar11 = operator_new(1);
            local_68 = SUB84(pvVar11,0);
            uStack_64 = (undefined4)((ulong)pvVar11 >> 0x20);
            std::
            vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
            ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                      ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                        *)(psVar3 + _Var8._M_value),
                       (stored_edge_property<unsigned_long,_boost::no_property> *)&local_70);
            pTVar14 = local_38;
            if ((void *)CONCAT44(uStack_64,local_68) != (void *)0x0) {
              operator_delete((void *)CONCAT44(uStack_64,local_68),1);
            }
            iVar7._M_current =
                 (pTVar14->activeNodes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pTVar14->activeNodes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              pTVar14 = (TwoStepBranchingProcedure *)&pTVar14->activeNodes;
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)pTVar14,iVar7,
                         &local_88._M_value);
            }
            else {
              *iVar7._M_current = (unsigned_long)local_88;
              (pTVar14->activeNodes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            uVar15 = CONCAT71((int7)((ulong)pTVar14 >> 8),1);
            _Var17 = local_88;
            goto LAB_00123b44;
          }
          _Var17._M_value = _Var17._M_value + 4;
        } while ((int *)_Var17._M_value != piVar6);
      }
      uVar15 = 0;
LAB_00123b44:
      bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_58);
      if (!bVar9) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
      }
      goto LAB_001239d3;
    }
    pVar19 = std::
             _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             ::_M_emplace<unsigned_long&>
                       ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)&this->nodesToDeactivate,&local_80);
    if (*(Status *)((long)&psVar3[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) == Root)
    {
      local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_emplace<int>(&(this->nodesToDeactivate)._M_h,local_58,pVar19._8_8_);
    }
    else if (*(Type *)((long)&psVar3[nodeId].super_StoredVertex.m_property.super_BaseNode + 4) !=
             DeactivatePlacement) {
      local_70._M_value =
           ((long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      local_58._0_8_ = (pointer)0x1ffffffff;
      local_58._8_4_ = 2;
      std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                ((PackingRelaxed2D *)(local_58 + 0x10));
      AddLeafNode(this,(Node *)local_58);
      std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      ~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                   *)(local_58 + 0x10));
      _Var8 = local_80;
      _Var17._M_value = local_70._M_value;
      _Var16 = local_70;
      if (local_70._M_value < local_80._M_value) {
        _Var16 = local_80;
      }
      if ((int *)(((long)(this->tree).super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->tree).super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <=
          _Var16._M_value) {
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::resize(this_00,_Var16._M_value + 1);
      }
      psVar3 = (this_00->
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_58._0_8_ = _Var17._M_value;
      local_58._8_8_ = operator_new(1);
      std::
      vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
      ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                  *)(psVar3 + _Var8._M_value),
                 (stored_edge_property<unsigned_long,_boost::no_property> *)local_58);
      if ((no_property *)local_58._8_8_ != (no_property *)0x0) {
        operator_delete((void *)local_58._8_8_,1);
      }
      iVar7._M_current =
           (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        this = (TwoStepBranchingProcedure *)&this->activeNodes;
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar7,
                   &local_70._M_value);
        _Var17 = local_70;
      }
      else {
        *iVar7._M_current = (unsigned_long)local_70;
        (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        _Var17 = local_70;
      }
      uVar15 = CONCAT71((int7)((ulong)this >> 8),1);
      goto LAB_001239d3;
    }
  }
  uVar15 = 0;
LAB_001239d3:
  oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar15 & 0xffffffff;
  oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var17._M_value;
  return (optional<unsigned_long>)
         oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();
    ////const std::unordered_set<size_t>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    const PackingRelaxed2D& packing = *currentNode.Packing;

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = packing.PlaceableItemsAtCurrentX.count();
    ////size_t numberOfRemainingItems = items.size() - placedItems.count();

    // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.
    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // AddDeactivatedPlacementNode()
        ////currentNode.Packing.ActiveX = currentNode.Packing.BackupX;
        ////currentNode.Packing.ActiveY = currentNode.Packing.BackupY;

        this->nodesToDeactivate.emplace(nodeId);

        if (currentNode.NodeStatus == BaseNode::Status::Root)
        {
            this->nodesToDeactivate.emplace(0);
            return std::nullopt;
        }

        if (currentNode.NodeType == BaseNode::Type::DeactivatePlacement)
        {
            return std::nullopt;
        }

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i] || !packing.PlaceableItemsAtCurrentX[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}